

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O3

void __thiscall
SqrtfTest::SqrtfTest
          (SqrtfTest *this,input_generator_t *inputGenerator,input_range_t *inputRange,
          uint64_t samplesInRange)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar5;
  undefined1 auVar4 [16];
  string local_68;
  _Any_data local_48;
  code *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sqrtf","");
  std::
  function<std::vector<float,_std::allocator<float>_>_(const_std::pair<float,_float>_&,_unsigned_long)>
  ::function((function<std::vector<float,_std::allocator<float>_>_(const_std::pair<float,_float>_&,_unsigned_long)>
              *)&local_48,inputGenerator);
  fVar3 = (*inputRange).first;
  fVar5 = (*inputRange).second;
  uVar1 = -(uint)(0.0 < fVar3);
  uVar2 = -(uint)(0.0 < fVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = CONCAT44(~uVar2,~uVar1) & 0x80000000800000 |
                 CONCAT44((uint)fVar5 & uVar2,(uint)fVar3 & uVar1);
  auVar4 = minps(_DAT_00176090,auVar4);
  Test<float,float,double>::Test<long_double(*)(long_double),float(*)(float)>
            ((Test<float,float,double> *)this,&local_68,(input_generator_t *)&local_48,auVar4._0_8_,
             samplesInRange,sqrtf_reference,dummyFunc);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SqrtfTest(input_generator_t inputGenerator, const input_range_t& inputRange, uint64_t samplesInRange)
        : Test(
            "sqrtf", inputGenerator,
            fixupInputRange(inputRange), samplesInRange, &sqrtf_reference, &dummyFunc)
    {
    }